

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalHashJoin::GetLocalSourceState
          (PhysicalHashJoin *this,ExecutionContext *context,GlobalSourceState *gstate)

{
  HashJoinGlobalSinkState *sink;
  Allocator *allocator;
  HashJoinLocalSourceState *this_00;
  
  sink = (HashJoinGlobalSinkState *)
         unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
         operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                     *)(context + 3));
  allocator = BufferAllocator::Get((ClientContext *)gstate->_vptr_GlobalSourceState);
  this_00 = (HashJoinLocalSourceState *)operator_new(0x710);
  HashJoinLocalSourceState::HashJoinLocalSourceState
            (this_00,(PhysicalHashJoin *)context,sink,allocator);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalHashJoin::GetLocalSourceState(ExecutionContext &context,
                                                                   GlobalSourceState &gstate) const {
	return make_uniq<HashJoinLocalSourceState>(*this, sink_state->Cast<HashJoinGlobalSinkState>(),
	                                           BufferAllocator::Get(context.client));
}